

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcSurfaceStyle::~IfcSurfaceStyle(IfcSurfaceStyle *this,void **vtt)

{
  void **vtt_local;
  IfcSurfaceStyle *this_local;
  
  (this->super_IfcPresentationStyle).
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPresentationStyle,_1UL>._vptr_ObjectHelper =
       (_func_int **)*vtt;
  *(void **)((long)&(this->super_IfcPresentationStyle).
                    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPresentationStyle,_1UL>.
                    _vptr_ObjectHelper +
            (long)(this->super_IfcPresentationStyle).
                  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPresentationStyle,_1UL>.
                  _vptr_ObjectHelper[-3]) = vtt[7];
  *(void **)&(this->super_IfcPresentationStyle).field_0x38 = vtt[8];
  STEP::ListOf<Assimp::STEP::EXPRESS::DataType,_1UL,_5UL>::~ListOf(&this->Styles);
  std::__cxx11::string::~string((string *)&(this->super_IfcPresentationStyle).field_0x48);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcSurfaceStyle,_2UL>::~ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcSurfaceStyle,_2UL> *)
             &(this->super_IfcPresentationStyle).field_0x38,vtt + 5);
  IfcPresentationStyle::~IfcPresentationStyle(&this->super_IfcPresentationStyle,vtt + 1);
  return;
}

Assistant:

IfcSurfaceStyle() : Object("IfcSurfaceStyle") {}